

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SpectrumMixTexture *
pbrt::SpectrumMixTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpectrumMixTexture *pSVar3;
  Allocator alloc_00;
  Allocator alloc_01;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  undefined1 local_b8 [16];
  undefined1 local_a8 [40];
  ulong local_80;
  SpectrumHandle local_78 [4];
  ulong local_58;
  string local_50 [32];
  undefined4 extraout_var_01;
  
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0;
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = 0x3f800000;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"tex1",&local_b9);
  alloc_00.memoryResource._4_4_ = 0;
  alloc_00.memoryResource._0_4_ = spectrumType;
  local_58 = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_a8,(string *)parameters,(SpectrumHandle *)local_50,
             (SpectrumType)&local_58,alloc_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"tex2",&local_ba);
  local_80 = CONCAT44(extraout_var_00,iVar2) | 0x1000000000000;
  alloc_01.memoryResource._4_4_ = 0;
  alloc_01.memoryResource._0_4_ = spectrumType;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)(local_b8 + 8),(string *)parameters,local_78,
             (SpectrumType)&local_80,alloc_01);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_a8 + 8),"amount",&local_bb);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_b8,(string *)parameters,0.5,
             (memory_resource *)(local_a8 + 8));
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pSVar3 = (SpectrumMixTexture *)CONCAT44(extraout_var_01,iVar1);
  (pSVar3->tex1).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_a8._0_8_;
  (pSVar3->tex2).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_b8._8_8_;
  (pSVar3->amount).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_b8._0_8_;
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_50);
  return pSVar3;
}

Assistant:

SpectrumMixTexture *SpectrumMixTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    return alloc.new_object<SpectrumMixTexture>(
        parameters.GetSpectrumTexture("tex1", zero, spectrumType, alloc),
        parameters.GetSpectrumTexture("tex2", one, spectrumType, alloc),
        parameters.GetFloatTexture("amount", 0.5f, alloc));
}